

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::readChar(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte bVar1;
  uint uVar2;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  requireDStackDepth(this,1,"READ-CHAR");
  requireDStackAvailable(this,1,"READ-CHAR");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"READ-CHAR","");
  GetFileHandle((Forth *)&local_58,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::ios::clear((int)local_58 + (int)*(undefined8 *)(*local_58 + -0x18));
  bVar1 = std::istream::get();
  ForthStack<unsigned_int>::setTop(this_00,(uint)bVar1);
  ForthStack<unsigned_int>::push
            (this_00,-(*(uint *)((long)local_58 + *(long *)(*local_58 + -0x18) + 0x20) & 1) &
                     0xffffffba);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void readChar() {
	REQUIRE_DSTACK_DEPTH(1, "READ-CHAR");
	REQUIRE_DSTACK_AVAILABLE(1, "READ-CHAR");
	auto h = (dStack.getTop());
	auto f = GetFileHandle(h, "READ-CHAR", errorReadFile);
	f->clear();
	auto ch = static_cast<unsigned char>(f->get());
	auto status = f->rdstate();
	dStack.setTop(static_cast<Cell>(ch));
	if (f->bad()) push(static_cast<Cell>(errorReadFile)); else push(0);
}